

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O3

int lprotocol(lua_State *L)

{
  int iVar1;
  uint proto;
  sproto *sp;
  lua_Integer lVar2;
  char *pcVar3;
  sproto_type *psVar4;
  
  sp = (sproto *)lua_touserdata(L,1);
  if (sp == (sproto *)0x0) {
    iVar1 = luaL_argerror(L,1,"Need a sproto_type object");
    return iVar1;
  }
  iVar1 = lua_type(L,2);
  if (iVar1 == 3) {
    lVar2 = lua_tointegerx(L,2,(int *)0x0);
    proto = (uint)lVar2;
    pcVar3 = sproto_protoname(sp,proto);
    if (pcVar3 == (char *)0x0) {
      return 0;
    }
    lua_pushstring(L,pcVar3);
  }
  else {
    pcVar3 = lua_tolstring(L,2,(size_t *)0x0);
    proto = sproto_prototag(sp,pcVar3);
    if ((int)proto < 0) {
      return 0;
    }
    lua_pushinteger(L,(ulong)proto);
  }
  psVar4 = sproto_protoquery(sp,proto,0);
  if (psVar4 == (sproto_type *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_pushlightuserdata(L,psVar4);
  }
  psVar4 = sproto_protoquery(sp,proto,1);
  if (psVar4 == (sproto_type *)0x0) {
    lua_pushnil(L);
  }
  else {
    lua_pushlightuserdata(L,psVar4);
  }
  return 3;
}

Assistant:

static int
lprotocol(lua_State *L) {
	struct sproto * sp = lua_touserdata(L, 1);
	struct sproto_type * request;
	struct sproto_type * response;
	int t;
	int tag;
	if (sp == NULL) {
		return luaL_argerror(L, 1, "Need a sproto_type object");
	}
	t = lua_type(L,2);
	if (t == LUA_TNUMBER) {
		const char * name;
		tag = lua_tointeger(L, 2);
		name = sproto_protoname(sp, tag);
		if (name == NULL)
			return 0;
		lua_pushstring(L, name);
	} else {
		const char * name = lua_tostring(L, 2);
		tag = sproto_prototag(sp, name);
		if (tag < 0)
			return 0;
		lua_pushinteger(L, tag);
	}
	request = sproto_protoquery(sp, tag, SPROTO_REQUEST);
	if (request == NULL) {
		lua_pushnil(L);
	} else {
		lua_pushlightuserdata(L, request);
	}
	response = sproto_protoquery(sp, tag, SPROTO_RESPONSE);
	if (response == NULL) {
		lua_pushnil(L);
	} else {
		lua_pushlightuserdata(L, response);
	}
	return 3;
}